

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_crt_check_cn(mbedtls_x509_buf *name,char *cn,size_t cn_len)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  uchar *puVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  uchar *n1;
  long lVar9;
  
  uVar3 = name->len;
  if (uVar3 == cn_len) {
    if (cn_len != 0) {
      sVar7 = 0;
      do {
        bVar2 = cn[sVar7];
        if ((bVar2 != name->p[sVar7]) &&
           (((name->p[sVar7] ^ bVar2) != 0x20 || (0x19 < (byte)((bVar2 & 0xdf) + 0xbf)))))
        goto LAB_0011e246;
        sVar7 = sVar7 + 1;
      } while (cn_len != sVar7);
    }
    iVar5 = 0;
  }
  else {
LAB_0011e246:
    sVar6 = strlen(cn);
    if ((2 < uVar3) && ((puVar4 = name->p, *puVar4 == '*' && (sVar6 != 0 && puVar4[1] == '.')))) {
      sVar8 = 0;
      do {
        if (cn[sVar8] == '.') {
          if ((sVar8 != 0) && (~sVar6 + uVar3 + sVar8 == 0)) {
            lVar9 = 0;
            while( true ) {
              bVar2 = puVar4[lVar9 + 1];
              if ((bVar2 != cn[sVar8 + lVar9]) &&
                 (((byte)(cn[sVar8 + lVar9] ^ bVar2) != 0x20 ||
                  (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))))) break;
              lVar1 = (sVar8 - sVar6) + lVar9;
              lVar9 = lVar9 + 1;
              if (lVar1 == -1) {
                return 0;
              }
            }
          }
          break;
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != sVar6);
    }
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int x509_crt_check_cn( const mbedtls_x509_buf *name,
                              const char *cn, size_t cn_len )
{
    /* try exact match */
    if( name->len == cn_len &&
        x509_memcasecmp( cn, name->p, cn_len ) == 0 )
    {
        return( 0 );
    }

    /* try wildcard match */
    if( x509_check_wildcard( cn, name ) == 0 )
    {
        return( 0 );
    }

    return( -1 );
}